

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_writer.c
# Opt level: O0

int dlep_writer_map_identity
              (dlep_writer *writer,oonf_layer2_data *data,oonf_layer2_metadata *meta,uint16_t tlv,
              uint16_t length,uint64_t scaling)

{
  oonf_layer2_data_type oVar1;
  bool bVar2;
  undefined1 *local_f0;
  void *value;
  uint8_t tmp8;
  uint16_t tmp16;
  __uint64_t _Stack_e0;
  uint32_t tmp32;
  uint64_t tmp64;
  int64_t l2value64;
  uint64_t scaling_local;
  uint16_t length_local;
  oonf_layer2_metadata *poStack_c0;
  uint16_t tlv_local;
  oonf_layer2_metadata *meta_local;
  oonf_layer2_data *data_local;
  dlep_writer *writer_local;
  oonf_layer2_data *local_a0;
  oonf_layer2_data *local_98;
  oonf_layer2_data *local_90;
  ulong local_88;
  int64_t result;
  uint64_t local_78;
  oonf_layer2_data *local_70;
  byte local_62 [2];
  _Bool result_1;
  oonf_layer2_data *poStack_60;
  ulong local_58;
  oonf_layer2_data *local_50;
  ulong *local_48;
  undefined4 local_3c;
  oonf_layer2_data *local_38;
  oonf_layer2_data *local_30;
  oonf_layer2_data *local_28;
  byte *local_20;
  undefined4 local_14;
  oonf_layer2_data *local_10;
  
  bVar2 = false;
  if (data->_origin != (oonf_layer2_origin *)0x0) {
    bVar2 = data->_meta != (oonf_layer2_metadata *)0x0;
  }
  if (bVar2) {
    if (meta->type == data->_meta->type) {
      oVar1 = data->_meta->type;
      if (oVar1 == OONF_LAYER2_INTEGER_DATA) {
        result = 0;
        local_88 = 0;
        local_48 = &local_88;
        bVar2 = false;
        if (data->_origin != (oonf_layer2_origin *)0x0) {
          bVar2 = data->_meta != (oonf_layer2_metadata *)0x0;
        }
        local_58 = scaling;
        if ((bVar2) && (local_30 = data, data->_meta->type == OONF_LAYER2_INTEGER_DATA)) {
          if (scaling == 0) {
            local_58 = data->_meta->scaling;
          }
          if (data->_meta->scaling < local_58) {
            local_88 = (data->_value).integer * (local_58 / data->_meta->scaling);
          }
          else {
            local_88 = (ulong)(data->_value).integer / (data->_meta->scaling / local_58);
          }
          local_3c = 0;
        }
        else {
          local_3c = 0xffffffff;
        }
        tmp64 = local_88;
        local_78 = scaling;
        local_70 = data;
        local_50 = data;
        local_38 = data;
      }
      else {
        if (oVar1 != OONF_LAYER2_BOOLEAN_DATA) {
          return -1;
        }
        local_62[1] = 0;
        local_62[0] = 0;
        local_20 = local_62;
        if ((data->_meta == (oonf_layer2_metadata *)0x0) ||
           (local_10 = data, data->_meta->type != OONF_LAYER2_BOOLEAN_DATA)) {
          local_14 = 0xffffffff;
        }
        else {
          local_62[0] = (data->_value).addr._addr[0] & 1;
          local_14 = 0;
        }
        tmp64 = (uint64_t)(int)(uint)(local_62[0] != 0);
        poStack_60 = data;
        local_28 = data;
      }
      l2value64 = scaling;
      scaling_local._4_2_ = length;
      scaling_local._6_2_ = tlv;
      poStack_c0 = meta;
      meta_local = (oonf_layer2_metadata *)data;
      data_local = (oonf_layer2_data *)writer;
      local_a0 = data;
      local_98 = data;
      local_90 = data;
      switch(length) {
      case 1:
        value._1_1_ = (undefined1)tmp64;
        local_f0 = (undefined1 *)((long)&value + 1);
        break;
      case 2:
        value._2_2_ = htons((uint16_t)tmp64);
        local_f0 = (undefined1 *)((long)&value + 2);
        break;
      default:
        return -1;
      case 4:
        value._4_4_ = htonl((uint32_t)tmp64);
        local_f0 = (undefined1 *)((long)&value + 4);
        break;
      case 8:
        _Stack_e0 = __bswap_64(tmp64);
        local_f0 = (undefined1 *)&stack0xffffffffffffff20;
      }
      dlep_writer_add_tlv((dlep_writer *)data_local,scaling_local._6_2_,local_f0,scaling_local._4_2_
                         );
      writer_local._4_4_ = 0;
    }
    else {
      writer_local._4_4_ = -1;
    }
  }
  else {
    writer_local._4_4_ = 0;
  }
  return writer_local._4_4_;
}

Assistant:

int
dlep_writer_map_identity(struct dlep_writer *writer, struct oonf_layer2_data *data,
  const struct oonf_layer2_metadata *meta, uint16_t tlv, uint16_t length, uint64_t scaling) {
  int64_t l2value64;
  uint64_t tmp64;
  uint32_t tmp32;
  uint16_t tmp16;
  uint8_t tmp8;
  void *value;

  if (!oonf_layer2_data_has_value(data)) {
    /* no data available */
    return 0;
  }
  if (meta->type != oonf_layer2_data_get_type(data)) {
    /* bad data type */
    return -1;
  }

  switch (oonf_layer2_data_get_type(data)) {
    case OONF_LAYER2_INTEGER_DATA:
      l2value64 = oonf_layer2_data_get_int64(data, scaling, 0);
      break;
    case OONF_LAYER2_BOOLEAN_DATA:
      l2value64 = oonf_layer2_data_get_boolean(data, false) ? 1 : 0;
      break;
    default:
      return -1;
  }

  switch (length) {
    case 8:
      tmp64 = htobe64((uint64_t)l2value64);
      value = &tmp64;
      break;
    case 4:
      tmp32 = htonl((uint32_t)((int32_t)l2value64));
      value = &tmp32;
      break;
    case 2:
      tmp16 = htons((uint16_t)((int16_t)l2value64));
      value = &tmp16;
      break;
    case 1:
      tmp8 = (uint8_t)((int8_t)l2value64);
      value = &tmp8;
      break;
    default:
      return -1;
  }

  dlep_writer_add_tlv(writer, tlv, value, length);
  return 0;
}